

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiSapBroadphase.cpp
# Opt level: O2

bool __thiscall
btMultiSapBroadphasePairSortPredicate::operator()
          (btMultiSapBroadphasePairSortPredicate *this,btBroadphasePair *a1,btBroadphasePair *b1)

{
  bool bVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  
  if (a1->m_pProxy0 == (btBroadphaseProxy *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = a1->m_pProxy0->m_multiSapParentProxy;
  }
  if (a1->m_pProxy1 == (btBroadphaseProxy *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = a1->m_pProxy1->m_multiSapParentProxy;
  }
  if (b1->m_pProxy0 == (btBroadphaseProxy *)0x0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = b1->m_pProxy0->m_multiSapParentProxy;
  }
  if (b1->m_pProxy1 == (btBroadphaseProxy *)0x0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = b1->m_pProxy1->m_multiSapParentProxy;
  }
  bVar1 = true;
  if (((pvVar2 <= pvVar4) && (bVar1 = pvVar5 < pvVar3 && pvVar2 == pvVar4, pvVar2 == pvVar4)) &&
     (pvVar3 <= pvVar5)) {
    if (pvVar3 == pvVar5) {
      return b1->m_algorithm < a1->m_algorithm;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator() ( const btBroadphasePair& a1, const btBroadphasePair& b1 ) const
		{
				btMultiSapBroadphase::btMultiSapProxy* aProxy0 = a1.m_pProxy0 ? (btMultiSapBroadphase::btMultiSapProxy*)a1.m_pProxy0->m_multiSapParentProxy : 0;
				btMultiSapBroadphase::btMultiSapProxy* aProxy1 = a1.m_pProxy1 ? (btMultiSapBroadphase::btMultiSapProxy*)a1.m_pProxy1->m_multiSapParentProxy : 0;
				btMultiSapBroadphase::btMultiSapProxy* bProxy0 = b1.m_pProxy0 ? (btMultiSapBroadphase::btMultiSapProxy*)b1.m_pProxy0->m_multiSapParentProxy : 0;
				btMultiSapBroadphase::btMultiSapProxy* bProxy1 = b1.m_pProxy1 ? (btMultiSapBroadphase::btMultiSapProxy*)b1.m_pProxy1->m_multiSapParentProxy : 0;

				 return aProxy0 > bProxy0 || 
					(aProxy0 == bProxy0 && aProxy1 > bProxy1) ||
					(aProxy0 == bProxy0 && aProxy1 == bProxy1 && a1.m_algorithm > b1.m_algorithm); 
		}